

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

bool __thiscall Board::operator==(Board *this,Board *board)

{
  uint uVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  size_t __n;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong local_40;
  bool local_31;
  
  uVar7 = (ulong)board->row;
  local_31 = 0 < (long)uVar7;
  if (0 < (long)uVar7) {
    uVar1 = board->column;
    pvVar2 = (this->matrix).
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_40 = 0;
    do {
      if (0 < (int)uVar1) {
        lVar3 = *(long *)&pvVar2[local_40].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        lVar4 = *(long *)&(board->matrix).
                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_40].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        lVar8 = 1;
        lVar9 = 0;
        bVar5 = 0 < (long)(int)uVar1;
        do {
          __n = *(size_t *)(lVar3 + 8 + lVar9);
          if ((__n == *(size_t *)(lVar4 + 8 + lVar9)) &&
             ((__n == 0 ||
              (iVar6 = bcmp(*(void **)(lVar3 + lVar9),*(void **)(lVar4 + lVar9),__n), iVar6 == 0))))
          {
            if (bVar5) {
              return local_31;
            }
            break;
          }
          bVar5 = lVar8 < (int)uVar1;
          lVar9 = lVar9 + 0x20;
          lVar8 = lVar8 + 1;
        } while ((ulong)uVar1 << 5 != lVar9);
      }
      local_40 = local_40 + 1;
      local_31 = local_40 < uVar7;
    } while (local_40 != uVar7);
  }
  return local_31;
}

Assistant:

bool operator==( Board board )
        {
            for( int i = 0; i < board.row; i++ )
            {
                for( int j = 0; j < board.column; j++ )
                {
                    if( this->matrix[i][j] == board.matrix[i][j] )
                    {
                        return true;
                    }
                }
            }

            return false;
        }